

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.h
# Opt level: O0

void __thiscall
chrono::ChLinkLockPointLine::ChLinkLockPointLine
          (ChLinkLockPointLine *this,ChLinkLockPointLine *param_1)

{
  ChLinkLockPointLine *param_1_local;
  ChLinkLockPointLine *this_local;
  
  chrono::ChLinkLock::ChLinkLock(&this->super_ChLinkLock,&param_1->super_ChLinkLock);
  *(undefined ***)this = &PTR__ChLinkLockPointLine_001459e0;
  return;
}

Assistant:

class ChApi ChLinkLockPointLine : public ChLinkLock {
  public:
    ChLinkLockPointLine() { ChangeLinkType(LinkType::POINTLINE); }

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLinkLockPointLine* Clone() const override { return new ChLinkLockPointLine(*this); }

    /// Lock the joint.
    /// If enabled (lock = true) this effectively converts this joint into a weld joint.
    /// If lock = false, the joint reverts to its original degrees of freedom.
    void Lock(bool lock);
}